

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxUnicode.cpp
# Opt level: O3

optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_> *
Jinx::Impl::GetUtf8CharsByRange
          (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>
           *__return_storage_ptr__,String *source,pair<long,_long> *range)

{
  undefined8 *puVar1;
  char *pcVar2;
  char *utf8Str;
  size_t sVar3;
  basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> local_50;
  
  if (range->second < range->first) {
    LogWriteLine(Error,"First range index is greater than second");
  }
  else {
    pcVar2 = GetUtf8CstrByIndex(source,range->first);
    utf8Str = GetUtf8CstrByIndex(source,range->second);
    if (pcVar2 != (char *)0x0 && utf8Str != (char *)0x0) {
      sVar3 = GetUtf8CharSize(utf8Str);
      local_50._M_string_length = 0;
      local_50.field_2._M_local_buf[0] = '\0';
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::reserve
                (&local_50,(range->second - range->first) + 1);
      if (pcVar2 < utf8Str + sVar3) {
        do {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::
          push_back(&local_50,*pcVar2);
          pcVar2 = pcVar2 + 1;
        } while (pcVar2 < utf8Str + sVar3);
      }
      puVar1 = (undefined8 *)
               ((long)&(__return_storage_ptr__->
                       super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_false,_false>
                       )._M_payload.
                       super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_true,_false,_false>
                       .
                       super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>
                       ._M_payload + 0x10);
      *(undefined8 **)
       &(__return_storage_ptr__->
        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_false,_false>
        )._M_payload.
        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>
        ._M_payload = puVar1;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_11
           *)local_50._M_dataplus._M_p == &local_50.field_2) {
        *puVar1 = CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                           local_50.field_2._M_local_buf[0]);
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->
                 super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_false,_false>
                 )._M_payload.
                 super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_true,_false,_false>
                 .
                 super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>
                 ._M_payload + 0x18) = local_50.field_2._8_8_;
      }
      else {
        (__return_storage_ptr__->
        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_false,_false>
        )._M_payload.
        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>
        ._M_payload._M_value._M_dataplus._M_p = local_50._M_dataplus._M_p;
        *(ulong *)((long)&(__return_storage_ptr__->
                          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_false,_false>
                          )._M_payload.
                          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_true,_false,_false>
                          .
                          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>
                          ._M_payload + 0x10) =
             CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,local_50.field_2._M_local_buf[0])
        ;
      }
      (__return_storage_ptr__->
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_false,_false>
      )._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>
      ._M_payload._M_value._M_string_length = local_50._M_string_length;
      (__return_storage_ptr__->
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_false,_false>
      )._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>
      ._M_engaged = true;
      return __return_storage_ptr__;
    }
  }
  (__return_storage_ptr__->
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_false,_false>
  )._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>
  ._M_engaged = false;
  return __return_storage_ptr__;
}

Assistant:

inline_t std::optional<String> GetUtf8CharsByRange(const String & source, const std::pair<int64_t, int64_t> & range)
	{
		if (range.first > range.second)
		{
			LogWriteLine(LogLevel::Error, "First range index is greater than second");
			return std::optional<String>();
		}
		const char * srcCurr = GetUtf8CstrByIndex(source, range.first);
		const char * srcEnd = GetUtf8CstrByIndex(source, range.second);
		if (srcCurr == nullptr || srcEnd == nullptr)
			return std::optional<String>();
		srcEnd += GetUtf8CharSize(srcEnd);
		String out;
		out.reserve(range.second - range.first + 1);
		while (srcCurr < srcEnd)
		{
			out += *srcCurr;
			++srcCurr;
		}
		return out;
	}